

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

BxDFFlags __thiscall
pbrt::TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
          (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this)

{
  float fVar1;
  DielectricInterfaceBxDF *pDVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  
  pDVar2 = this->top;
  if (pDVar2 != (DielectricInterfaceBxDF *)0x0) {
    auVar3 = vminss_avx(ZEXT416((uint)(pDVar2->mfDistrib).alpha_y),
                        ZEXT416((uint)(pDVar2->mfDistrib).alpha_x));
    return (uint)(auVar3._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
  }
  fVar1 = (this->bottom->R).values.values[0];
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar4 == 2) {
        return Unset;
      }
      fVar1 = (this->bottom->R).values.values[uVar4 + 2];
      uVar4 = uVar4 + 1;
    } while ((fVar1 == 0.0) && (!NAN(fVar1)));
    return (uint)(uVar4 < 3) * 5;
  }
  return DiffuseReflection;
}

Assistant:

PBRT_CPU_GPU
    BxDFFlags Flags() const { return top ? top->Flags() : bottom->Flags(); }